

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::ProgramBinaryUniformResetCase::verifyUniformFloat
          (ProgramBinaryUniformResetCase *this,ShaderProgram *program,string *name)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  GLint location;
  GLfloat floatVar;
  GLfloat local_344;
  long *local_340;
  long local_338;
  long local_330 [2];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  this_00 = &(this->super_ProgramBinaryCase).super_CallLogWrapper;
  location = glu::CallLogWrapper::glGetUniformLocation
                       (this_00,(program->m_program).m_program,(name->_M_dataplus)._M_p);
  local_344 = -1.0;
  glu::CallLogWrapper::glGetUniformfv(this_00,(program->m_program).m_program,location,&local_344);
  if ((local_344 != 0.0) || (NAN(local_344))) {
    local_1a8._0_8_ =
         ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    this_01 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"Fail, expected zero value for ",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", received: ",0xc);
    std::__cxx11::ostringstream::ostringstream(local_320);
    std::ostream::_M_insert<double>((double)local_344);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_320);
    std::ios_base::~ios_base(local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,(char *)local_340,local_338);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_340 != local_330) {
      operator_delete(local_340,local_330[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(this_01);
    std::ios_base::~ios_base(local_130);
    tcu::TestContext::setTestResult
              ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Uniform value not reset");
  }
  return;
}

Assistant:

void verifyUniformFloat (glu::ShaderProgram& program, const std::string& name)
	{
		const GLint	floatLoc	= glGetUniformLocation(program.getProgram(), name.c_str());
		GLfloat		floatVar	= -1;

		glGetUniformfv(program.getProgram(), floatLoc, &floatVar);

		if (floatVar != 0.0f)
		{
			m_testCtx.getLog() << TestLog::Message << "Fail, expected zero value for " << name << ", received: " << de::toString(floatVar) << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Uniform value not reset");
		}
	}